

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O2

Mesh * __thiscall ResourcePack::get_mesh(ResourcePack *this,string *name)

{
  size_type sVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
          ::count(&this->meshes,name);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
             ::operator[](&this->meshes,name);
    return pmVar2;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"mesh not loaded ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

Mesh * ResourcePack::get_mesh(std::string& name) {
    if (meshes.count(name)) {
        return &meshes[name];
    }
    else {
        std::cout << "mesh not loaded " << name << std::endl;
        exit(1);
    }
}